

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnTableSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index table_index)

{
  Result RVar1;
  
  if (name.size_ == 0) {
    name = BinaryReaderObjdumpBase::GetTableName(&this->super_BinaryReaderObjdumpBase,table_index);
  }
  PrintDetails(this,"   - %d: T <%.*s> table=%u",(ulong)index,name.size_ & 0xffffffff,name.data_,
               table_index);
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnTableSymbol(Index index,
                                          uint32_t flags,
                                          string_view name,
                                          Index table_index) {
  if (name.empty()) {
    name = GetTableName(table_index);
  }
  PrintDetails("   - %d: T <" PRIstringview "> table=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), table_index);
  return PrintSymbolFlags(flags);
}